

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBinaryHelper(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  bool bVar5;
  Opnd *src1;
  Opnd *src2;
  OpLayoutType local_38;
  OpLayoutType local_34;
  OpLayoutType local_30;
  OpLayoutType local_2c;
  Instr *local_28;
  Instr *instrPrev;
  Instr *pIStack_18;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  local_28 = (Instr *)0x0;
  instrPrev._4_4_ = helperMethod;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  local_2c = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
  bVar2 = Js::OpLayoutType::operator==(&local_2c,Reg1Unsigned1);
  bVar5 = true;
  if (!bVar2) {
    local_30 = Js::OpCodeUtil::GetOpCodeLayout(pIStack_18->m_opcode);
    bVar2 = Js::OpLayoutType::operator==(&local_30,Reg3);
    bVar5 = true;
    if (!bVar2) {
      local_34 = Js::OpCodeUtil::GetOpCodeLayout(pIStack_18->m_opcode);
      bVar2 = Js::OpLayoutType::operator==(&local_34,Reg2);
      bVar5 = true;
      if (!bVar2) {
        local_38 = Js::OpCodeUtil::GetOpCodeLayout(pIStack_18->m_opcode);
        bVar2 = Js::OpLayoutType::operator==(&local_38,Reg2Int1);
        bVar5 = true;
        if (!bVar2) {
          src2._4_4_ = Js::OpCodeUtil::GetOpCodeLayout(pIStack_18->m_opcode);
          bVar2 = Js::OpLayoutType::operator==((OpLayoutType *)((long)&src2 + 4),ElementU);
          bVar5 = true;
          if (!bVar2) {
            bVar5 = pIStack_18->m_opcode == InvalCachedScope;
          }
        }
      }
    }
  }
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x224d,
                       "((Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg1Unsigned1) || Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3 || Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2 || Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2Int1 || Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::ElementU || instr->m_opcode == Js::OpCode::InvalCachedScope)"
                       ,"Expected a binary instruction...");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::UnlinkSrc2(pIStack_18);
  if (instrPrev._4_4_ != HelperOP_CmSrEq_EmptyString) {
    local_28 = LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_18,pOVar4);
  }
  pOVar4 = IR::Instr::UnlinkSrc1(pIStack_18);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_18,pOVar4);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,pIStack_18,instrPrev._4_4_,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return local_28;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelper(IR::Instr *instr, IR::JnHelperMethod helperMethod)
{
    // The only case where this would still be null when we return is when
    // helperMethod == HelperOP_CmSrEq_EmptyString; in which case we ignore
    // instrPrev.
    IR::Instr *instrPrev = nullptr;

    AssertMsg((Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg1Unsigned1) ||
              Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3 ||
              Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2 ||
              Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2Int1 ||
              Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::ElementU ||
              instr->m_opcode == Js::OpCode::InvalCachedScope, "Expected a binary instruction...");

    IR::Opnd *src2 = instr->UnlinkSrc2();
    if (helperMethod != IR::HelperOP_CmSrEq_EmptyString)
        instrPrev = m_lowererMD.LoadHelperArgument(instr, src2);

    IR::Opnd *src1 = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, src1);

    m_lowererMD.ChangeToHelperCall(instr, helperMethod);

    return instrPrev;
}